

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

Frame * rw::countCB(Frame *f,void *count)

{
  Frame *pFVar1;
  Frame *f_00;
  
  *(int *)count = *count + 1;
  f_00 = f->child;
  while (f_00 != (Frame *)0x0) {
    pFVar1 = f_00->next;
    countCB(f_00,count);
    f_00 = pFVar1;
  }
  return f;
}

Assistant:

static Frame*
countCB(Frame *f, void *count)
{
	(*(int32*)count)++;
	f->forAllChildren(countCB, count);
	return f;
}